

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O1

FT_Error ft_add_renderer(FT_Module module)

{
  FT_Library pFVar1;
  FT_Memory pFVar2;
  FT_Module_Class *pFVar3;
  code *pcVar4;
  int iVar5;
  FT_ListNode pFVar6;
  FT_Renderer_conflict pFVar7;
  FT_ListNode pFVar8;
  FT_ListRec *pFVar9;
  int iVar10;
  FT_Renderer_conflict render;
  
  pFVar1 = module->library;
  pFVar2 = pFVar1->memory;
  pFVar6 = (FT_ListNode)(*pFVar2->alloc)(pFVar2,0x18);
  iVar10 = (uint)(pFVar6 == (FT_ListNode)0x0) << 6;
  if (pFVar6 == (FT_ListNode)0x0) {
    return iVar10;
  }
  pFVar3 = module->clazz;
  module[1].clazz = pFVar3;
  *(int *)&module[1].library = (int)pFVar3[1].module_flags;
  if ((pFVar3[1].module_interface != (void *)0x0) &&
     (pcVar4 = *(code **)((long)pFVar3[1].module_interface + 8), pcVar4 != (code *)0x0)) {
    iVar10 = (*pcVar4)(pFVar2,&module[4].library);
    iVar5 = 3;
    if (iVar10 != 0) goto LAB_00219e78;
    module[4].memory = *(FT_Memory *)((long)pFVar3[1].module_interface + 0x20);
    module[5].clazz = (FT_Module_Class *)pFVar3[1].module_size;
  }
  if ((int)pFVar3[1].module_flags == 0x53564720) {
    module[5].clazz = (FT_Module_Class *)pFVar3[1].module_size;
  }
  pFVar6->data = module;
  pFVar8 = (pFVar1->renderers).tail;
  pFVar6->next = (FT_ListNode)0x0;
  pFVar6->prev = pFVar8;
  pFVar9 = (FT_ListRec *)&pFVar8->next;
  if (pFVar8 == (FT_ListNode)0x0) {
    pFVar9 = &pFVar1->renderers;
  }
  pFVar9->head = pFVar6;
  (pFVar1->renderers).tail = pFVar6;
  pFVar8 = (pFVar1->renderers).head;
  while ((pFVar7 = (FT_Renderer_conflict)0x0, pFVar8 != (FT_ListNode)0x0 &&
         (pFVar7 = (FT_Renderer_conflict)pFVar8->data,
         pFVar7->glyph_format != FT_GLYPH_FORMAT_OUTLINE))) {
    pFVar8 = pFVar8->next;
  }
  pFVar1->cur_renderer = pFVar7;
  iVar5 = 0;
LAB_00219e78:
  if ((((iVar5 == 3) || (iVar5 == 0)) && (pFVar6 != (FT_ListNode)0x0)) && (iVar10 != 0)) {
    (*pFVar2->free)(pFVar2,pFVar6);
  }
  return iVar10;
}

Assistant:

static FT_Error
  ft_add_renderer( FT_Module  module )
  {
    FT_Library   library = module->library;
    FT_Memory    memory  = library->memory;
    FT_Error     error;
    FT_ListNode  node    = NULL;


    if ( FT_QNEW( node ) )
      goto Exit;

    {
      FT_Renderer         render = FT_RENDERER( module );
      FT_Renderer_Class*  clazz  = (FT_Renderer_Class*)module->clazz;


      render->clazz        = clazz;
      render->glyph_format = clazz->glyph_format;

      /* allocate raster object if needed */
      if ( clazz->raster_class && clazz->raster_class->raster_new )
      {
        error = clazz->raster_class->raster_new( memory, &render->raster );
        if ( error )
          goto Fail;

        render->raster_render = clazz->raster_class->raster_render;
        render->render        = clazz->render_glyph;
      }

#ifdef FT_CONFIG_OPTION_SVG
      if ( clazz->glyph_format == FT_GLYPH_FORMAT_SVG )
        render->render = clazz->render_glyph;
#endif

      /* add to list */
      node->data = module;
      FT_List_Add( &library->renderers, node );

      ft_set_current_renderer( library );
    }

  Fail:
    if ( error )
      FT_FREE( node );

  Exit:
    return error;
  }